

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCompositeDeepScanLine.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_604d5::data<float>::checkValues
          (data<float> *this,vector<float,_std::allocator<float>_> *data,Box2i *dw,
          bool dontbothercheckingdepth)

{
  float fVar1;
  bool bVar2;
  size_type sVar3;
  ulong uVar4;
  reference pvVar5;
  reference pvVar6;
  const_reference pvVar7;
  ostream *poVar8;
  reference pvVar9;
  void *pvVar10;
  size_type sVar11;
  byte in_CL;
  vector<float,_std::allocator<float>_> *in_RSI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  double dVar12;
  size_t i_1;
  size_t i;
  size_t channel;
  size_t pel;
  size_t size;
  char *in_stack_fffffffffffffef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  Box<Imath_3_2::Vec2<int>_> *in_stack_ffffffffffffff08;
  ulong local_58;
  ulong local_50;
  size_type local_48;
  size_type local_40;
  int local_34;
  int local_30;
  
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(in_RDI);
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::size(in_stack_ffffffffffffff08);
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::size(in_stack_ffffffffffffff08);
  uVar4 = sVar3 + (long)((local_30 + 1) * (local_34 + 1));
  local_40 = 0;
  local_48 = 0;
  if ((in_CL & 1) == 0) {
    for (local_58 = 0; local_58 < uVar4; local_58 = local_58 + 1) {
      pvVar5 = std::
               vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               ::operator[]((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                             *)(in_RDI + 2),local_40);
      pvVar6 = std::vector<float,_std::allocator<float>_>::operator[](pvVar5,local_48);
      fVar1 = *pvVar6;
      pvVar7 = std::vector<float,_std::allocator<float>_>::operator[](in_RSI,local_58);
      dVar12 = std::fabs((double)(ulong)(uint)(fVar1 - *pvVar7));
      if (0.005 < SUB84(dVar12,0)) {
        poVar8 = std::operator<<((ostream *)&std::cout,"sample ");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_58);
        poVar8 = std::operator<<(poVar8," (channel ");
        pvVar9 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](in_RDI,local_48);
        poVar8 = std::operator<<(poVar8,(string *)pvVar9);
        poVar8 = std::operator<<(poVar8," of pixel ");
        sVar3 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(in_RDI);
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_58 % sVar3);
        std::operator<<(poVar8,") ");
        poVar8 = std::operator<<((ostream *)&std::cout,"doesn\'t match expected value (channel ");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_48);
        poVar8 = std::operator<<(poVar8," of pixel ");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_40);
        std::operator<<(poVar8,") : ");
        poVar8 = std::operator<<((ostream *)&std::cout,"got ");
        pvVar7 = std::vector<float,_std::allocator<float>_>::operator[](in_RSI,local_58);
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,*pvVar7);
        poVar8 = std::operator<<(poVar8," expected ");
        pvVar5 = std::
                 vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                 ::operator[]((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                               *)(in_RDI + 2),local_40);
        pvVar6 = std::vector<float,_std::allocator<float>_>::operator[](pvVar5,local_48);
        pvVar10 = (void *)std::ostream::operator<<(poVar8,*pvVar6);
        std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
      }
      pvVar5 = std::
               vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               ::operator[]((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                             *)(in_RDI + 2),local_40);
      pvVar6 = std::vector<float,_std::allocator<float>_>::operator[](pvVar5,local_48);
      fVar1 = *pvVar6;
      pvVar7 = std::vector<float,_std::allocator<float>_>::operator[](in_RSI,local_58);
      dVar12 = std::fabs((double)(ulong)(uint)(fVar1 - *pvVar7));
      if (0.005 < SUB84(dVar12,0)) {
        __assert_fail("fabs (_results[pel][channel] - data[i]) <= 0.005",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testCompositeDeepScanLine.cpp"
                      ,0x182,
                      "void (anonymous namespace)::data<float>::checkValues(const vector<T> &, const Box2i &, bool) [T = float]"
                     );
      }
      local_48 = local_48 + 1;
      sVar3 = local_48;
      sVar11 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size(in_RDI);
      if (sVar3 == sVar11) {
        local_48 = 0;
        local_40 = local_40 + 1;
        sVar3 = local_40;
        sVar11 = std::
                 vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                 ::size((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                         *)(in_RDI + 2));
        if (sVar3 == sVar11) {
          local_40 = 0;
        }
      }
    }
  }
  else {
    for (local_50 = 0; local_50 < uVar4; local_50 = local_50 + 1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](in_RDI,local_48);
      bVar2 = std::operator!=(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      if (bVar2) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](in_RDI,local_48);
        bVar2 = std::operator!=(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
        if (bVar2) {
          pvVar5 = std::
                   vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   ::operator[]((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                 *)(in_RDI + 2),local_40);
          pvVar6 = std::vector<float,_std::allocator<float>_>::operator[](pvVar5,local_48);
          fVar1 = *pvVar6;
          pvVar7 = std::vector<float,_std::allocator<float>_>::operator[](in_RSI,local_50);
          dVar12 = std::fabs((double)(ulong)(uint)(fVar1 - *pvVar7));
          if (0.005 < SUB84(dVar12,0)) {
            poVar8 = std::operator<<((ostream *)&std::cout,"sample ");
            poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_50);
            poVar8 = std::operator<<(poVar8," (channel ");
            pvVar9 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](in_RDI,local_48);
            poVar8 = std::operator<<(poVar8,(string *)pvVar9);
            poVar8 = std::operator<<(poVar8," of pixel ");
            sVar3 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size(in_RDI);
            poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_50 % sVar3);
            std::operator<<(poVar8,") ");
            poVar8 = std::operator<<((ostream *)&std::cout,"doesn\'t match expected value (channel "
                                    );
            poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_48);
            poVar8 = std::operator<<(poVar8," of pixel ");
            poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_40);
            std::operator<<(poVar8,") : ");
            poVar8 = std::operator<<((ostream *)&std::cout,"got ");
            pvVar7 = std::vector<float,_std::allocator<float>_>::operator[](in_RSI,local_50);
            poVar8 = (ostream *)std::ostream::operator<<(poVar8,*pvVar7);
            poVar8 = std::operator<<(poVar8," expected ");
            pvVar5 = std::
                     vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                     ::operator[]((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                   *)(in_RDI + 2),local_40);
            pvVar6 = std::vector<float,_std::allocator<float>_>::operator[](pvVar5,local_48);
            pvVar10 = (void *)std::ostream::operator<<(poVar8,*pvVar6);
            std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
          }
          pvVar5 = std::
                   vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   ::operator[]((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                 *)(in_RDI + 2),local_40);
          pvVar6 = std::vector<float,_std::allocator<float>_>::operator[](pvVar5,local_48);
          fVar1 = *pvVar6;
          pvVar7 = std::vector<float,_std::allocator<float>_>::operator[](in_RSI,local_50);
          dVar12 = std::fabs((double)(ulong)(uint)(fVar1 - *pvVar7));
          if (0.005 < SUB84(dVar12,0)) {
            __assert_fail("fabs (_results[pel][channel] - data[i]) <= 0.005",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testCompositeDeepScanLine.cpp"
                          ,0x16a,
                          "void (anonymous namespace)::data<float>::checkValues(const vector<T> &, const Box2i &, bool) [T = float]"
                         );
          }
        }
      }
      local_48 = local_48 + 1;
      sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(in_RDI);
      if (local_48 == sVar3) {
        local_48 = 0;
        local_40 = local_40 + 1;
        sVar3 = std::
                vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                ::size((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                        *)(in_RDI + 2));
        if (local_40 == sVar3) {
          local_40 = 0;
        }
      }
    }
  }
  return;
}

Assistant:

void checkValues (
        const vector<T>& data, const Box2i& dw, bool dontbothercheckingdepth)
    {
        size_t size =
            _channels.size () + (dw.size ().x + 1) * (dw.size ().y + 1);
        size_t pel     = 0;
        size_t channel = 0;
        if (dontbothercheckingdepth)
        {
            for (size_t i = 0; i < size; i++)
            {
                if (_channels[channel] != "Z" && _channels[channel] != "ZBack")
                {
                    if (fabs (_results[pel][channel] - data[i]) > 0.005)
                    {
                        cout << "sample " << i << " (channel "
                             << _channels[channel] << " of pixel "
                             << i % _channels.size () << ") ";
                        cout << "doesn't match expected value (channel "
                             << channel << " of pixel " << pel << ") : ";
                        cout << "got " << data[i] << " expected "
                             << _results[pel][channel] << endl;
                    }
                    assert (fabs (_results[pel][channel] - data[i]) <= 0.005);
                }
                channel++;
                if (channel == _channels.size ())
                {
                    channel = 0;
                    pel++;
                    if (pel == _results.size ()) { pel = 0; }
                }
            }
        }
        else
        {
            for (size_t i = 0; i < size; i++)
            {
                if (fabs (_results[pel][channel] - data[i]) > 0.005)
                {
                    cout << "sample " << i << " (channel " << _channels[channel]
                         << " of pixel " << i % _channels.size () << ") ";
                    cout << "doesn't match expected value (channel " << channel
                         << " of pixel " << pel << ") : ";
                    cout << "got " << data[i] << " expected "
                         << _results[pel][channel] << endl;
                }
                assert (fabs (_results[pel][channel] - data[i]) <= 0.005);
                channel++;
                if (channel == _channels.size ())
                {
                    channel = 0;
                    pel++;
                    if (pel == _results.size ()) { pel = 0; }
                }
            }
        }
    }